

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *handler)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  handle handle;
  uint uVar1;
  error_handler *begin_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_01;
  int in_ECX;
  error_handler *this;
  format_arg arg;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  adapter;
  unkbyte10 in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff82;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_78;
  undefined4 local_68;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_58;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  local_38;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(handler,(char *)begin_00,begin + 2);
    goto LAB_0031c58b;
  }
  if (*begin_00 == (error_handler)0x7d) {
    uVar1 = basic_format_parse_context<char,_fmt::v7::detail::error_handler>::next_arg_id
                      (&handler->parse_context);
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)&local_78.string,(detail *)&handler->context,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)uVar1,
               in_ECX);
    out_01.container =
         (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
         container;
    local_58.args.desc_._0_4_ = (undefined4)(handler->context).args_.desc_;
    local_58.args.desc_._4_4_ = *(undefined4 *)((long)&(handler->context).args_.desc_ + 4);
    local_58.args.field_1._0_4_ = *(undefined4 *)&(handler->context).args_.field_1;
    local_58.args.field_1._4_4_ = *(undefined4 *)((long)&(handler->context).args_.field_1 + 4);
    local_58.loc.locale_ = (handler->context).loc_.locale_;
    local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
    switch(local_68) {
    case 1:
switchD_0031c396_caseD_1:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                     (out_01.container,local_78.int_value);
      break;
    case 2:
switchD_0031c396_caseD_2:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                     (out_01.container,local_78.uint_value);
      break;
    case 3:
switchD_0031c396_caseD_3:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                     (out_01.container,CONCAT44(local_78.long_long_value._4_4_,local_78.int_value));
      break;
    case 4:
switchD_0031c396_caseD_4:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                     (out_01.container,CONCAT44(local_78.long_long_value._4_4_,local_78.int_value));
      break;
    case 5:
switchD_0031c396_caseD_5:
      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
           local_78.long_long_value._4_4_;
      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
           local_78.int_value;
      value._10_6_ = in_stack_ffffffffffffff82;
      value._0_10_ = in_stack_ffffffffffffff78;
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                     (out_01.container,out,(__int128)value);
      break;
    case 6:
switchD_0031c396_caseD_6:
      out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
           local_78.long_long_value._4_4_;
      out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
           local_78.int_value;
      value_00._10_6_ = in_stack_ffffffffffffff82;
      value_00._0_10_ = in_stack_ffffffffffffff78;
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                     (out_01.container,out_00,(unsigned___int128)value_00);
      break;
    case 7:
switchD_0031c396_caseD_7:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container,local_78.bool_value);
      break;
    case 8:
switchD_0031c396_caseD_8:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container,local_78.char_value);
      break;
    case 9:
switchD_0031c396_caseD_9:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                     (out_01.container,local_78.float_value);
      break;
    case 10:
switchD_0031c396_caseD_a:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                     (out_01.container,
                      (double)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value));
      break;
    case 0xb:
switchD_0031c396_caseD_b:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                     (out_01.container,
                      (longdouble)
                      CONCAT28(local_78.int128_value._8_2_,
                               CONCAT44(local_78.long_long_value._4_4_,local_78.int_value)));
      break;
    case 0xc:
switchD_0031c396_caseD_c:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>
                     (out_01.container,
                      (char *)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value));
      break;
    case 0xd:
switchD_0031c396_caseD_d:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      buffer<char>::append<char>
                (out_01.container,
                 (char *)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value),
                 (char *)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value) +
                 CONCAT62(local_78.int128_value._10_6_,local_78.int128_value._8_2_));
      break;
    case 0xe:
switchD_0031c396_caseD_e:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)
           write<char,fmt::v7::detail::buffer_appender<char>>
                     (out_01.container,
                      (void *)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value));
      break;
    case 0xf:
switchD_0031c396_caseD_f:
      handle.custom_.value._4_4_ = local_78.long_long_value._4_4_;
      handle.custom_.value._0_4_ = local_78.int_value;
      handle.custom_.format._0_2_ = local_78.int128_value._8_2_;
      handle.custom_.format._2_6_ = local_78.int128_value._10_6_;
      out_01.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                     (&local_58,handle);
      break;
    default:
switchD_0031c396_default:
      local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
      out_01.container =
           (buffer<char> *)write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container);
    }
    (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         out_01.container;
LAB_0031c58b:
    return (char *)(begin_00 + 1);
  }
  local_38.arg_id = 0;
  this = begin_00;
  local_38.handler = handler;
  begin_00 = (error_handler *)
             parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                       ((char *)begin_00,end,&local_38);
  if (begin_00 == (error_handler *)end) {
LAB_0031c5ab:
    error_handler::on_error(this,"missing \'}\' in format string");
  }
  if (*begin_00 == (error_handler)0x3a) {
    begin_00 = (error_handler *)
               format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               ::on_format_specs(handler,local_38.arg_id,(char *)(begin_00 + 1),end);
    if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
      error_handler::on_error((error_handler *)handler,"unknown format specifier");
    }
    goto LAB_0031c58b;
  }
  if (*begin_00 != (error_handler)0x7d) goto LAB_0031c5ab;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)&local_78.string,(detail *)&handler->context,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
             (ulong)(uint)local_38.arg_id,in_ECX);
  out_01.container =
       (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  local_58.args.desc_._0_4_ = (undefined4)(handler->context).args_.desc_;
  local_58.args.desc_._4_4_ = *(undefined4 *)((long)&(handler->context).args_.desc_ + 4);
  local_58.args.field_1._0_4_ = *(undefined4 *)&(handler->context).args_.field_1;
  local_58.args.field_1._4_4_ = *(undefined4 *)((long)&(handler->context).args_.field_1 + 4);
  local_58.loc.locale_ = (handler->context).loc_.locale_;
  local_58.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_01.container;
  switch(local_68) {
  case 1:
    goto switchD_0031c396_caseD_1;
  case 2:
    goto switchD_0031c396_caseD_2;
  case 3:
    goto switchD_0031c396_caseD_3;
  case 4:
    goto switchD_0031c396_caseD_4;
  case 5:
    goto switchD_0031c396_caseD_5;
  case 6:
    goto switchD_0031c396_caseD_6;
  case 7:
    goto switchD_0031c396_caseD_7;
  case 8:
    goto switchD_0031c396_caseD_8;
  case 9:
    goto switchD_0031c396_caseD_9;
  case 10:
    goto switchD_0031c396_caseD_a;
  case 0xb:
    goto switchD_0031c396_caseD_b;
  case 0xc:
    goto switchD_0031c396_caseD_c;
  case 0xd:
    goto switchD_0031c396_caseD_d;
  case 0xe:
    goto switchD_0031c396_caseD_e;
  case 0xf:
    goto switchD_0031c396_caseD_f;
  default:
    goto switchD_0031c396_default;
  }
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}